

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.hpp
# Opt level: O0

void bits::write_int(uint32_t **word,uint32_t x,uint8_t *offset,uint8_t len)

{
  uint8_t uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint8_t len_local;
  uint8_t *offset_local;
  uint32_t x_local;
  uint32_t **word_local;
  
  uVar4 = *(uint *)(lo_set + (long)(int)(len & 0x3f) * 4) & x;
  if ((uint)*offset + (uint)len < 0x20) {
    **word = (-1 << (*offset + len & 0x1f) | *(uint *)(lo_set + (ulong)*offset * 4)) & **word;
    **word = uVar4 << (*offset & 0x1f) | **word;
    *offset = *offset + len;
  }
  else {
    **word = *(uint *)(lo_set + (ulong)*offset * 4) & **word;
    **word = uVar4 << (*offset & 0x1f) | **word;
    uVar1 = *offset;
    *offset = uVar1 + len;
    if ((byte)(uVar1 + len) < 0x21) {
      *offset = '\0';
      *word = *word + 1;
    }
    else {
      *offset = *offset & 0x1f;
      uVar2 = *(uint *)(lo_set + (ulong)*offset * 4);
      puVar3 = *word;
      *word = puVar3 + 1;
      puVar3[1] = (uVar2 ^ 0xffffffff) & puVar3[1];
      **word = uVar4 >> (len - *offset & 0x1f) | **word;
    }
  }
  return;
}

Assistant:

inline void write_int(
    uint32_t*& word, uint32_t x, uint8_t& offset, const uint8_t len)
{
    x &= lo_set[len & 63];
    if (offset + len < 32) {
        *word &= ((all_set << (offset + len))
            | lo_set[offset]); // mask 1..10..01..1
        *word |= (x << offset);
        offset += len;
    } else {
        *word &= ((lo_set[offset])); // mask 0....01..1
        *word |= (x << offset);
        if ((offset = (offset + len)) > 32) { // offset+len >= 32
            offset &= 31;
            *(++word) &= (~lo_set[offset]); // mask 1...10..0
            *word |= (x >> (len - offset));
        } else {
            offset = 0;
            ++word;
        }
    }
}